

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::add_sp_n(GB *this)

{
  long lVar1;
  u8 x;
  u16 uVar2;
  
  lVar1 = (this->s).op_tick;
  if (lVar1 == 0x1e) {
    (this->s).op_tick = -2;
  }
  else if (lVar1 == 0xe) {
    x = read_n(this);
    uVar2 = add_sp(this,x);
    (this->s).sp = uVar2;
  }
  return;
}

Assistant:

void GB::add_sp_n() {
  switch (s.op_tick) {
    case 14: s.sp = add_sp(read_n()); break;
    case 30: op_done(); break;
  }
}